

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

char * ImGui::GetKeyName(ImGuiKey key)

{
  if (key < ImGuiKey_NamedKey_BEGIN) {
    key = (GImGui->IO).KeyMap[key];
    if (key == ~ImGuiKey_KeysData_OFFSET) {
      return "N/A";
    }
    if (key == ImGuiKey_KeysData_OFFSET) {
      return "None";
    }
  }
  if ((key & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) {
    key = ConvertSingleModFlagToKey(key);
  }
  if (key - ImGuiKey_NamedKey_BEGIN < 0x8c) {
    return _ZL9GKeyNames_rel +
           *(int *)(_ZL9GKeyNames_rel + (ulong)(key - ImGuiKey_NamedKey_BEGIN) * 4);
  }
  return "Unknown";
}

Assistant:

inline bool             IsLegacyKey(ImGuiKey key)                                   { return key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_LegacyNativeKey_END; }